

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.cpp
# Opt level: O2

void __thiscall
libtorrent::anon_unknown_5::bits_shift_right(anon_unknown_5 *this,span<unsigned_int> number,int n)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  iVar3 = (int)number.m_len;
  iVar7 = (int)number.m_ptr;
  iVar6 = (int)((long)iVar3 / 0x20);
  if (iVar7 - iVar6 != 0 && iVar6 <= iVar7) {
    if (0x1f < iVar3) {
      uVar2 = (long)iVar3 / 0x20 & 0xffffffff;
      memmove(this + uVar2 * 4,this,(long)(iVar7 - iVar6) << 2);
      memset(this,0,uVar2 << 2);
      iVar3 = iVar3 + iVar6 * -0x20;
    }
    if (0 < iVar3) {
      uVar5 = *(uint *)(this + (long)iVar7 * 4 + -4);
      *(uint *)(this + (long)iVar7 * 4 + -4) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      bVar1 = (byte)iVar3;
      for (uVar2 = (ulong)(iVar7 - 1); 0 < (int)uVar2; uVar2 = uVar2 - 1) {
        uVar5 = *(uint *)(this + uVar2 * 4);
        uVar4 = *(uint *)(this + uVar2 * 4 + -4);
        uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        *(uint *)(this + uVar2 * 4 + -4) = uVar4;
        uVar5 = uVar4 << (0x20 - bVar1 & 0x1f) | uVar5 >> (bVar1 & 0x1f);
        *(uint *)(this + uVar2 * 4) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      }
      uVar5 = *(uint *)this >> (bVar1 & 0x1f);
      *(uint *)this =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
    return;
  }
  memset(this,0,(long)number.m_ptr << 2);
  return;
}

Assistant:

void bits_shift_right(span<std::uint32_t> const number, int n) noexcept
	{
		TORRENT_ASSERT(n >= 0);
		int const num_words = n / 32;
		int const number_size = int(number.size());
		if (num_words >= number_size)
		{
			std::memset(number.data(), 0, std::size_t(number.size() * 4));
			return;
		}
		if (num_words > 0)
		{
			std::memmove(number.data() + num_words
				, number.data(), std::size_t(number_size - num_words) * sizeof(std::uint32_t));
			std::memset(number.data(), 0, std::size_t(num_words) * sizeof(std::uint32_t));
			n -= num_words * 32;
		}
		if (n > 0)
		{
			// keep in mind that the uint32_t are stored in network
			// byte order, so they have to be byteswapped before
			// applying the shift operations, and then byteswapped
			// back again.
			number[number_size - 1] = aux::network_to_host(number[number_size - 1]);

			for (int i = number_size - 1; i > 0; --i)
			{
				number[i] >>= n;
				number[i - 1] = aux::network_to_host(number[i - 1]);
				number[i] |= (number[i - 1] << (32 - n)) & 0xffffffff;
				number[i] = aux::host_to_network(number[i]);
			}
			number[0] >>= n;
			number[0] = aux::host_to_network(number[0]);
		}
	}